

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__decode_uint8_srgb_AR(float *decodep,int width_times_channels,void *inputp)

{
  byte *pbVar1;
  float *decode;
  float *pfVar2;
  
  pbVar1 = (byte *)((long)inputp + 1);
  pfVar2 = decodep;
  while (pfVar2 + 4 <= decodep + width_times_channels) {
    *pfVar2 = stbir__srgb_uchar_to_linear_float[*pbVar1];
    pfVar2[1] = stbir__srgb_uchar_to_linear_float[pbVar1[-1]];
    pfVar2[2] = stbir__srgb_uchar_to_linear_float[pbVar1[2]];
    pfVar2[3] = stbir__srgb_uchar_to_linear_float[pbVar1[1]];
    pbVar1 = pbVar1 + 4;
    pfVar2 = pfVar2 + 4;
  }
  for (; pfVar2 < decodep + width_times_channels; pfVar2 = pfVar2 + 2) {
    *pfVar2 = stbir__srgb_uchar_to_linear_float[*pbVar1];
    pfVar2[1] = stbir__srgb_uchar_to_linear_float[pbVar1[-1]];
    pbVar1 = pbVar1 + 2;
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint8_srgb)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float const * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const *)inputp;

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  while( decode <= decode_end )
  {
    decode[0-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order0 ] ];
    decode[1-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order1 ] ];
    decode[2-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order2 ] ];
    decode[3-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order3 ] ];
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order0 ] ];
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order1 ] ];
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order2 ] ];
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}